

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadGridMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer *ppGVar1;
  undefined4 uVar2;
  string *psVar3;
  undefined8 uVar4;
  GridMeshNode *this_00;
  size_t in_RCX;
  undefined8 *in_RDX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *sig;
  ulong uVar5;
  iterator __position;
  uchar *in_R8;
  size_t in_R9;
  long lVar6;
  undefined1 auVar7 [16];
  Ref<embree::XML> animation;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> grids;
  Ref<embree::SceneGraph::MaterialNode> material;
  undefined1 local_a8 [8];
  __atomic_base<unsigned_long> local_a0;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_98;
  Vec3fa *local_88;
  XMLLoader *local_80;
  undefined1 local_78 [48];
  _Alloc_hider local_48;
  _Alloc_hider local_40;
  undefined8 local_38;
  
  psVar3 = (string *)*in_RDX;
  local_a0._M_i = (__int_type)&local_98._M_refcount;
  local_80 = (XMLLoader *)xml;
  local_78._32_8_ = in_RDX;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"material","");
  XML::child((XML *)local_78,psVar3);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffc0,(Ref<embree::XML> *)local_80);
  if ((long *)local_78._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 0x18))();
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_i != &local_98._M_refcount) {
    operator_delete((void *)local_a0._M_i);
  }
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_48._M_p = local_40._M_p;
  if ((_Base_ptr)local_40._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_40._M_p + 0x10))();
  }
  SceneGraph::GridMeshNode::GridMeshNode
            (this_00,(Ref<embree::SceneGraph::MaterialNode> *)&local_48,(BBox1f)0x3f80000000000000,0
            );
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  local_38 = this;
  if ((_Base_ptr)local_48._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_48._M_p + 0x18))();
  }
  psVar3 = *(string **)local_78._32_8_;
  local_a0._M_i = (__int_type)&local_98._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"animated_positions","");
  XML::childOpt((XML *)local_a8,psVar3);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_i != &local_98._M_refcount) {
    operator_delete((void *)local_a0._M_i);
  }
  if (local_a8 == (undefined1  [8])0x0) {
    psVar3 = *(string **)local_78._32_8_;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"positions","");
    XML::childOpt((XML *)(local_78 + 0x28),psVar3);
    loadVec3faArray((avector<Vec3fa> *)&local_a0,local_80,(Ref<embree::XML> *)(local_78 + 0x28));
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this_00->positions,
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               &local_a0);
    alignedFree(local_88);
    local_98._M_ptr = (element_type *)0x0;
    local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88 = (Vec3fa *)0x0;
    if ((long *)local_78._40_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_78._40_8_ + 0x18))();
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_);
    }
  }
  else if ((((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            ((long)local_a8 + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish !=
           (((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
            ((long)local_a8 + 0x80))->
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>)
           ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      XML::child((XML *)local_78,(size_t)local_a8);
      loadVec3faArray((avector<Vec3fa> *)&local_a0,local_80,(Ref<embree::XML> *)local_78);
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this_00->positions,(avector<Vec3fa> *)&local_a0);
      alignedFree(local_88);
      local_98._M_ptr = (element_type *)0x0;
      local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88 = (Vec3fa *)0x0;
      if ((long *)local_78._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_78._0_8_ + 0x18))();
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)((long)local_a8 + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                      *)((long)local_a8 + 0x80))->
                                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_a8 != (undefined1  [8])0x0) {
    (*((RefCount *)local_a8)->_vptr_RefCount[3])();
  }
  psVar3 = *(string **)local_78._32_8_;
  local_a0._M_i = (__int_type)&local_98._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"grids","");
  XML::childOpt((XML *)local_a8,psVar3);
  __position._M_current = (Grid *)local_80;
  loadVec4iArray((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)local_78,local_80
                 ,(Ref<embree::XML> *)local_a8);
  sig = extraout_RDX;
  if (local_a8 != (undefined1  [8])0x0) {
    (*((RefCount *)local_a8)->_vptr_RefCount[3])();
    sig = extraout_RDX_00;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_i != &local_98._M_refcount) {
    operator_delete((void *)local_a0._M_i);
    sig = extraout_RDX_01;
  }
  if (local_78._8_8_ != local_78._0_8_) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      local_a0._M_i = *(__int_type *)(local_78._0_8_ + lVar6 + -8);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_78._0_8_ + lVar6);
      auVar7 = pshuflw(auVar7,auVar7,0xe8);
      uVar2 = auVar7._0_4_;
      local_98._M_ptr._0_4_ = uVar2;
      __position._M_current =
           (this_00->grids).
           super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->grids).
          super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
        ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
                  (&this_00->grids,__position,(Grid *)&local_a0);
        sig = extraout_RDX_02;
      }
      else {
        (__position._M_current)->resX = (short)uVar2;
        (__position._M_current)->resY = (short)((uint)uVar2 >> 0x10);
        (__position._M_current)->startVtx = (int)local_a0._M_i;
        (__position._M_current)->lineStride = (int)(local_a0._M_i >> 0x20);
        ppGVar1 = &(this_00->grids).
                   super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      uVar5 = uVar5 + 1;
      in_RCX = (long)(local_78._8_8_ - local_78._0_8_) >> 4;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < in_RCX);
  }
  SceneGraph::GridMeshNode::verify
            (this_00,(EVP_PKEY_CTX *)__position._M_current,sig,in_RCX,in_R8,in_R9);
  uVar4 = local_38;
  *(GridMeshNode **)local_38 = this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if ((long *)local_78._0_8_ != (long *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  if ((_Base_ptr)local_40._M_p != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_40._M_p + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)uVar4;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadGridMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    std::vector<Vec4i> grids = loadVec4iArray(xml->childOpt("grids"));
    for (size_t i=0; i<grids.size(); i++) 
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(grids[i].x,grids[i].y,grids[i].z,grids[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }